

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcid.c
# Opt level: O1

FT_Error FT_Get_CID_Is_Internally_CID_Keyed(FT_Face face,FT_Bool *is_cid)

{
  FT_Module_Requester p_Var1;
  FT_Error FVar2;
  FT_Module_Interface pvVar3;
  FT_Bool ic;
  FT_Bool local_19;
  
  local_19 = '\0';
  FVar2 = 6;
  if (face != (FT_Face)0x0) {
    p_Var1 = ((face->driver->root).clazz)->get_interface;
    if (p_Var1 == (FT_Module_Requester)0x0) {
      pvVar3 = (FT_Module_Interface)0x0;
    }
    else {
      pvVar3 = (*p_Var1)(&face->driver->root,"CID");
    }
    if ((pvVar3 != (FT_Module_Interface)0x0) && (*(code **)((long)pvVar3 + 8) != (code *)0x0)) {
      FVar2 = (**(code **)((long)pvVar3 + 8))(face,&local_19);
    }
  }
  if (is_cid != (FT_Bool *)0x0) {
    *is_cid = local_19;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_CID_Is_Internally_CID_Keyed( FT_Face   face,
                                      FT_Bool  *is_cid )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_Bool   ic = 0;


    if ( face )
    {
      FT_Service_CID  service;


      FT_FACE_FIND_SERVICE( face, service, CID );

      if ( service && service->get_is_cid )
        error = service->get_is_cid( face, &ic);
    }

    if ( is_cid )
      *is_cid = ic;

    return error;
  }